

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucnv_bld.cpp
# Opt level: O0

UBool ucnv_deleteSharedConverterData(UConverterSharedData *deadSharedData)

{
  UDataMemory *data;
  UConverterSharedData *deadSharedData_local;
  
  if (deadSharedData->referenceCounter == 0) {
    if (deadSharedData->impl->unload != (UConverterUnload)0x0) {
      (*deadSharedData->impl->unload)(deadSharedData);
    }
    if (deadSharedData->dataMemory != (void *)0x0) {
      udata_close_63((UDataMemory *)deadSharedData->dataMemory);
    }
    uprv_free_63(deadSharedData);
    deadSharedData_local._7_1_ = '\x01';
  }
  else {
    deadSharedData_local._7_1_ = '\0';
  }
  return deadSharedData_local._7_1_;
}

Assistant:

static UBool
ucnv_deleteSharedConverterData(UConverterSharedData * deadSharedData)
{
    UTRACE_ENTRY_OC(UTRACE_UCNV_UNLOAD);
    UTRACE_DATA2(UTRACE_OPEN_CLOSE, "unload converter %s shared data %p", deadSharedData->staticData->name, deadSharedData);

    if (deadSharedData->referenceCounter > 0) {
        UTRACE_EXIT_VALUE((int32_t)FALSE);
        return FALSE;
    }

    if (deadSharedData->impl->unload != NULL) {
        deadSharedData->impl->unload(deadSharedData);
    }

    if(deadSharedData->dataMemory != NULL)
    {
        UDataMemory *data = (UDataMemory*)deadSharedData->dataMemory;
        udata_close(data);
    }

    uprv_free(deadSharedData);

    UTRACE_EXIT_VALUE((int32_t)TRUE);
    return TRUE;
}